

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExportDirWrapper.cpp
# Opt level: O1

QString * __thiscall
ExportDirWrapper::getLibraryName(QString *__return_storage_ptr__,ExportDirWrapper *this)

{
  bool bVar1;
  char *inp;
  storage_type *psVar2;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  Data *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  inp = _getLibraryName(this);
  if (inp == (char *)0x0) {
    QVar4.m_data = (storage_type *)0x0;
    QVar4.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar4);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = local_30;
  }
  else {
    bVar1 = pe_util::isStrLonger(inp,100);
    if (!bVar1) {
      psVar2 = (storage_type *)strlen(inp);
      QVar5.m_data = psVar2;
      QVar5.m_size = (qsizetype)&local_30;
      QString::fromUtf8(QVar5);
      (__return_storage_ptr__->d).size = 0;
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).d = local_30;
      (__return_storage_ptr__->d).ptr = local_28;
      goto LAB_001342b0;
    }
    QVar3.m_data = (storage_type *)0x9;
    QVar3.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar3);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = local_30;
  }
  (__return_storage_ptr__->d).ptr = local_28;
LAB_001342b0:
  (__return_storage_ptr__->d).size = local_20;
  return __return_storage_ptr__;
}

Assistant:

QString ExportDirWrapper::getLibraryName()
{
    char *name = this->_getLibraryName();
    if (!name) return name;

    if (pe_util::isStrLonger(name, 100)) {
        return INVALID_NAME;
    }
    return QString(name);
}